

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  char *__s1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  uint uVar6;
  allocator<char> local_261;
  char *local_260;
  Compression local_254;
  int local_250;
  Compression c;
  undefined8 local_248;
  char **local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  views;
  vector<const_char_*,_std::allocator<const_char_*>_> inFiles;
  allocator<char> local_1f8 [32];
  string local_1d8 [32];
  stringstream e;
  ostream local_1a8 [376];
  
  views.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  views.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  views.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
    anon_unknown.dwarf_f7c2::usageMessage((ostream *)&std::cerr,*argv,false);
    iVar2 = -1;
LAB_001046a1:
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&inFiles.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&views);
    return iVar2;
  }
  local_250 = argc + -2;
  local_254 = PIZ_COMPRESSION;
  local_248 = 0;
  pcVar3 = (char *)0x0;
  local_240 = argv;
  for (uVar6 = 1; local_260 = pcVar3, (int)uVar6 < argc; uVar6 = uVar6 + iVar2) {
    ppcVar1 = local_240 + uVar6;
    __s1 = *ppcVar1;
    if (*__s1 == '-') {
      if ((__s1[1] == 'z') && (__s1[2] == '\0')) {
        if (local_250 < (int)uVar6) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"Missing compression value with -z option")
          ;
          goto LAB_001046e3;
        }
        std::__cxx11::string::string<std::allocator<char>>(local_1d8,ppcVar1[1],&local_261);
        Imf_3_4::getCompressionIdFromName(local_1d8,&c);
        local_254 = c;
        if (c == NUM_COMPRESSION_METHODS) {
          std::__cxx11::stringstream::stringstream((stringstream *)&e);
          poVar4 = std::operator<<(local_1a8,"Unknown compression method \"");
          poVar4 = std::operator<<(poVar4,local_1d8);
          std::operator<<(poVar4,"\"");
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::invalid_argument::invalid_argument(piVar5,(string *)local_1f8);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::string::~string(local_1d8);
        iVar2 = 2;
        pcVar3 = local_260;
      }
      else {
        if ((__s1[1] != 'v') || (__s1[2] != '\0')) {
          if ((__s1[1] != 'h') || (__s1[2] != '\0')) goto LAB_0010448e;
          goto LAB_001045c9;
        }
        local_248 = CONCAT71((uint7)(uint3)(uVar6 >> 8),1);
        iVar2 = 1;
      }
    }
    else {
LAB_0010448e:
      iVar2 = strcmp(__s1,"--help");
      if (iVar2 == 0) {
LAB_001045c9:
        anon_unknown.dwarf_f7c2::usageMessage((ostream *)&std::cout,"exrmultiview",true);
        goto LAB_0010469f;
      }
      iVar2 = strcmp(__s1,"--version");
      if (iVar2 == 0) {
        pcVar3 = (char *)Imf_3_4::getLibraryVersion();
        poVar4 = std::operator<<((ostream *)&std::cout,"exrmultiview (OpenEXR) ");
        std::operator<<(poVar4,"3.4.0");
        iVar2 = strcmp(pcVar3,"3.4.0");
        if (iVar2 != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
          poVar4 = std::operator<<(poVar4,pcVar3);
          std::operator<<(poVar4,")");
        }
        poVar4 = std::operator<<((ostream *)&std::cout," https://openexr.com");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "Copyright (c) Contributors to the OpenEXR Project");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_0010469f;
      }
      if ((local_250 < (int)uVar6) || (*ppcVar1[1] == '-')) {
        iVar2 = 1;
        pcVar3 = __s1;
        if (local_260 != (char *)0x0) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"improper output file specified");
          goto LAB_001046e3;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&e,__s1,local_1f8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&views,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&inFiles,ppcVar1 + 1);
        iVar2 = 2;
        pcVar3 = local_260;
      }
    }
  }
  if ((ulong)((long)views.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)views.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Must specify at least two views");
  }
  else {
    if (pcVar3 != (char *)0x0) {
      makeMultiView(&views,&inFiles,pcVar3,local_254,(bool)((byte)local_248 & 1));
LAB_0010469f:
      iVar2 = 0;
      goto LAB_001046a1;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Must specify an output file");
  }
LAB_001046e3:
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int
main (int argc, char** argv)
{
    vector<string>      views;
    vector<const char*> inFiles;
    const char*         outFile     = 0;
    Compression         compression = PIZ_COMPRESSION;
    bool                verbose     = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {

        int i = 1;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-z"))
            {
                //
                // Set compression method
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "Missing compression value with -z option");

                compression = getCompression (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmultiview", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmultiview (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // View or image file name
                //

                if (i > argc - 2 || argv[i + 1][0] == '-')
                {
                    //
                    // Output file
                    //

                    if (outFile)
                        throw invalid_argument (
                            "improper output file specified");

                    outFile = argv[i];
                    i += 1;
                }
                else
                {
                    //
                    // View plus input file
                    //

                    views.push_back (argv[i]);
                    inFiles.push_back (argv[i + 1]);
                    i += 2;
                }
            }
        }

        if (views.size () < 2)
            throw invalid_argument ("Must specify at least two views");

        if (outFile == 0)
            throw invalid_argument ("Must specify an output file");

        //
        // Load inFiles, and save a combined multi-view image in outFile.
        //

        makeMultiView (views, inFiles, outFile, compression, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return -1;
    }

    return 0;
}